

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

hash_t __thiscall duckdb::Expression::Hash(Expression *this)

{
  hash_t hVar1;
  hash_t hVar2;
  ulong local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  hVar1 = MurmurHash64((ulong)(this->super_BaseExpression).type);
  hVar2 = LogicalType::Hash(&this->return_type);
  local_38 = hVar2 ^ hVar1;
  local_30._8_8_ = 0;
  local_18 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression.cpp:110:40)>
             ::_M_invoke;
  local_20 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression.cpp:110:40)>
             ::_M_manager;
  local_30._M_unused._M_object = &local_38;
  ExpressionIterator::EnumerateChildren
            (this,(function<void_(const_duckdb::Expression_&)> *)&local_30);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return local_38;
}

Assistant:

hash_t Expression::Hash() const {
	hash_t hash = duckdb::Hash<uint32_t>(static_cast<uint32_t>(type));
	hash = CombineHash(hash, return_type.Hash());
	ExpressionIterator::EnumerateChildren(*this,
	                                      [&](const Expression &child) { hash = CombineHash(child.Hash(), hash); });
	return hash;
}